

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFunctionalTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::ShaderLibraryTest::init(ShaderLibraryTest *this,EVP_PKEY_CTX *ctx)

{
  TestContext *testCtx;
  int extraout_EAX;
  RenderContext *renderCtx;
  ContextInfo *contextInfo;
  char *fileName_00;
  size_type sVar1;
  reference ppTVar2;
  int local_74;
  undefined1 local_70 [4];
  int i;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> children;
  string local_48 [8];
  string fileName;
  ShaderLibrary shaderLibrary;
  ShaderLibraryTest *this_local;
  
  testCtx = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  renderCtx = gles31::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  contextInfo = gles31::Context::getContextInfo((this->super_TestCaseGroup).m_context);
  deqp::gls::ShaderLibrary::ShaderLibrary
            ((ShaderLibrary *)((long)&fileName.field_2 + 8),testCtx,renderCtx,contextInfo);
  std::__cxx11::string::string(local_48,(string *)&this->m_filename);
  fileName_00 = (char *)std::__cxx11::string::c_str();
  deqp::gls::ShaderLibrary::loadShaderFile
            ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_70,
             (ShaderLibrary *)((long)&fileName.field_2 + 8),fileName_00);
  local_74 = 0;
  while( true ) {
    sVar1 = std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::size
                      ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_70);
    if ((int)sVar1 <= local_74) break;
    ppTVar2 = std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::operator[]
                        ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_70,
                         (long)local_74);
    tcu::TestNode::addChild((TestNode *)this,*ppTVar2);
    local_74 = local_74 + 1;
  }
  std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::~vector
            ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_70);
  std::__cxx11::string::~string(local_48);
  deqp::gls::ShaderLibrary::~ShaderLibrary((ShaderLibrary *)((long)&fileName.field_2 + 8));
  return extraout_EAX;
}

Assistant:

void init (void)
	{
		gls::ShaderLibrary			shaderLibrary(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo());
		std::string					fileName	= m_filename;
		std::vector<tcu::TestNode*>	children	= shaderLibrary.loadShaderFile(fileName.c_str());

		for (int i = 0; i < (int)children.size(); i++)
			addChild(children[i]);
	}